

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_rp_qsort(nk_rp_rect *array,uint len,_func_int_void_ptr_void_ptr *cmp)

{
  nk_rp_coord nVar1;
  nk_rp_coord nVar2;
  int iVar3;
  nk_rp_coord nVar4;
  nk_rp_coord nVar5;
  int iVar6;
  nk_rp_rect *pnVar7;
  uint uVar8;
  nk_rp_rect *pnVar9;
  int iVar10;
  nk_rp_rect tmp;
  nk_rp_rect pivot;
  uint seed;
  uint pos;
  uint stack [64];
  uint left;
  uint right;
  _func_int_void_ptr_void_ptr *cmp_local;
  uint len_local;
  nk_rp_rect *array_local;
  
  stack[0x3e] = 0;
  pivot.was_packed = 0;
  pivot._8_4_ = (len >> 1) * 0x10dcd + 1;
  cmp_local._4_4_ = len;
  while( true ) {
    while (stack[0x3e] + 1 < cmp_local._4_4_) {
      if (pivot.was_packed == 0x40) {
        pivot.was_packed = 0;
        cmp_local._4_4_ = seed;
      }
      tmp._8_8_ = *(undefined8 *)
                   (array + (stack[0x3e] + (uint)pivot._8_4_ % (cmp_local._4_4_ - stack[0x3e])));
      pivot._8_4_ = pivot._8_4_ * 0x10dcd + 1;
      iVar10 = pivot.was_packed + 1;
      (&seed)[(uint)pivot.was_packed] = cmp_local._4_4_;
      stack[0x3f] = stack[0x3e] - 1;
      while( true ) {
        do {
          stack[0x3f] = stack[0x3f] + 1;
          iVar6 = (*cmp)(array + stack[0x3f],&tmp.x);
          uVar8 = cmp_local._4_4_;
        } while (iVar6 < 0);
        do {
          cmp_local._4_4_ = uVar8;
          uVar8 = cmp_local._4_4_ - 1;
          iVar6 = (*cmp)(&tmp.x,array + uVar8);
        } while (iVar6 < 0);
        pivot.was_packed = iVar10;
        if (uVar8 <= stack[0x3f]) break;
        pnVar7 = array + stack[0x3f];
        iVar3 = pnVar7->id;
        nVar4 = pnVar7->w;
        nVar5 = pnVar7->h;
        tmp._0_8_ = *(undefined8 *)&pnVar7->x;
        pnVar7 = array + stack[0x3f];
        pnVar9 = array + uVar8;
        nVar1 = pnVar9->w;
        nVar2 = pnVar9->h;
        pnVar7->id = pnVar9->id;
        pnVar7->w = nVar1;
        pnVar7->h = nVar2;
        nVar1 = pnVar9->y;
        iVar6 = pnVar9->was_packed;
        pnVar7->x = pnVar9->x;
        pnVar7->y = nVar1;
        pnVar7->was_packed = iVar6;
        pnVar7 = array + uVar8;
        pnVar7->id = iVar3;
        pnVar7->w = nVar4;
        pnVar7->h = nVar5;
        *(undefined8 *)&pnVar7->x = tmp._0_8_;
        cmp_local._4_4_ = uVar8;
      }
    }
    if (pivot.was_packed == 0) break;
    stack[0x3e] = cmp_local._4_4_;
    cmp_local._4_4_ = (&seed)[pivot.was_packed - 1U];
    pivot.was_packed = pivot.was_packed - 1U;
  }
  return;
}

Assistant:

static void
nk_rp_qsort(struct nk_rp_rect *array, unsigned int len, int(*cmp)(const void*,const void*))
{
    /* iterative quick sort */
    #define NK_MAX_SORT_STACK 64
    unsigned right, left = 0, stack[NK_MAX_SORT_STACK], pos = 0;
    unsigned seed = len/2 * 69069+1;
    for (;;) {
        for (; left+1 < len; len++) {
            struct nk_rp_rect pivot, tmp;
            if (pos == NK_MAX_SORT_STACK) len = stack[pos = 0];
            pivot = array[left+seed%(len-left)];
            seed = seed * 69069 + 1;
            stack[pos++] = len;
            for (right = left-1;;) {
                while (cmp(&array[++right], &pivot) < 0);
                while (cmp(&pivot, &array[--len]) < 0);
                if (right >= len) break;
                tmp = array[right];
                array[right] = array[len];
                array[len] = tmp;
            }
        }
        if (pos == 0) break;
        left = len;
        len = stack[--pos];
    }
    #undef NK_MAX_SORT_STACK
}